

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O1

void __thiscall ATeleportFog::PostBeginPlay(ATeleportFog *this)

{
  FState *newstate;
  FName *label;
  FName local_14;
  FName local_10;
  FSoundID local_c;
  
  AActor::PostBeginPlay(&this->super_AActor);
  local_c.ID = S_FindSound("misc/teleport");
  S_Sound(&this->super_AActor,4,&local_c,1.0,1.0);
  if (gameinfo.gametype != GAME_Heretic) {
    if (gameinfo.gametype == GAME_Strife) {
      label = &local_14;
      local_14.Index = 0xb;
      goto LAB_00458fff;
    }
    if (gameinfo.gametype != GAME_Hexen) {
      return;
    }
  }
  label = &local_10;
  local_10.Index = 0xc;
LAB_00458fff:
  newstate = AActor::FindState(&this->super_AActor,label);
  AActor::SetState(&this->super_AActor,newstate,false);
  return;
}

Assistant:

void ATeleportFog::PostBeginPlay ()
{
	Super::PostBeginPlay ();
	S_Sound (this, CHAN_BODY, "misc/teleport", 1, ATTN_NORM);
	switch (gameinfo.gametype)
	{
	case GAME_Hexen:
	case GAME_Heretic:
		SetState(FindState(NAME_Raven));
		break;

	case GAME_Strife:
		SetState(FindState(NAME_Strife));
		break;
		
	default:
		break;
	}
}